

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Fillet3.cpp
# Opt level: O3

void __thiscall
chrono::ChFunction_Fillet3::ChFunction_Fillet3(ChFunction_Fillet3 *this,ChFunction_Fillet3 *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_00b44790;
  dVar1 = other->y1;
  dVar2 = other->y2;
  dVar3 = other->dy1;
  dVar4 = other->dy2;
  dVar5 = other->c1;
  dVar6 = other->c2;
  dVar7 = other->c3;
  this->end = other->end;
  this->y1 = dVar1;
  this->y2 = dVar2;
  this->dy1 = dVar3;
  this->dy2 = dVar4;
  this->c1 = dVar5;
  this->c2 = dVar6;
  this->c3 = dVar7;
  this->c4 = other->c4;
  return;
}

Assistant:

ChFunction_Fillet3::ChFunction_Fillet3(const ChFunction_Fillet3& other) {
    end = other.end;
    y1 = other.y1;
    y2 = other.y2;
    dy1 = other.dy1;
    dy2 = other.dy2;
    c1 = other.c1;
    c2 = other.c2;
    c3 = other.c3;
    c4 = other.c4;
}